

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  buffer<char> *in_RDI;
  size_t i;
  char *out;
  size_t free_cap;
  make_unsigned_t<long> count;
  size_t in_stack_ffffffffffffffb8;
  ulong local_38;
  ulong local_20;
  long local_10;
  
  for (local_10 = in_RSI; local_10 != CONCAT71(in_register_00000011,in_DL);
      local_10 = local_20 + local_10) {
    local_20 = to_unsigned<long>((long)in_RDI);
    try_reserve(in_RDI,in_stack_ffffffffffffffb8);
    uVar3 = in_RDI->capacity_ - in_RDI->size_;
    if (uVar3 < local_20) {
      local_20 = uVar3;
    }
    pcVar1 = in_RDI->ptr_;
    sVar2 = in_RDI->size_;
    for (local_38 = 0; local_38 < local_20; local_38 = local_38 + 1) {
      pcVar1[local_38 + sVar2] = *(char *)(local_10 + local_38);
    }
    in_RDI->size_ = local_20 + in_RDI->size_;
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }